

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.h
# Opt level: O2

void __thiscall
spvtools::val::BasicBlock::RegisterStructuralSuccessor(BasicBlock *this,BasicBlock *block)

{
  BasicBlock *local_20;
  BasicBlock *local_18;
  
  local_20 = this;
  local_18 = block;
  std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
  emplace_back<spvtools::val::BasicBlock*>
            ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
             &block->structural_predecessors_,&local_20);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::push_back
            (&this->structural_successors_,&local_18);
  return;
}

Assistant:

void RegisterStructuralSuccessor(BasicBlock* block) {
    block->structural_predecessors_.push_back(this);
    structural_successors_.push_back(block);
  }